

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::echo(TestMoreStuffImpl *this,EchoContext context)

{
  ClientHook *pCVar1;
  long *in_RDX;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar7;
  Promise<void> PVar8;
  Builder result;
  Reader params;
  SegmentBuilder *local_f0;
  Own<capnp::ClientHook> OStack_e8;
  PointerBuilder local_d8;
  int iStack_c0;
  undefined4 uStack_bc;
  StructBuilder local_b8;
  PointerReader local_88;
  StructReader local_68;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_d8);
  local_b8.pointers = (WirePointer *)CONCAT44(uStack_bc,iStack_c0);
  local_b8.data = local_d8.pointer;
  local_b8.segment = local_d8.segment;
  local_b8.capTable = local_d8.capTable;
  PointerReader::getStruct(&local_68,(PointerReader *)&local_b8,(word *)0x0);
  local_88.segment._0_1_ = 0;
  (**(code **)(*in_RDX + 0x10))(&local_f0);
  local_d8.pointer = (WirePointer *)OStack_e8.ptr;
  local_d8.segment = local_f0;
  local_d8.capTable = (CapTableBuilder *)OStack_e8.disposer;
  PointerBuilder::getStruct(&local_b8,&local_d8,(StructSize)0x10000,(word *)0x0);
  bVar2 = local_68.pointerCount != 0;
  local_d8.pointer = (WirePointer *)0x0;
  if (bVar2) {
    local_d8.pointer = local_68.pointers;
  }
  iStack_c0 = 0x7fffffff;
  if (bVar2) {
    iStack_c0 = local_68.nestingLimit;
  }
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (bVar2) {
    uVar3 = local_68.segment._0_4_;
    uVar4 = local_68.segment._4_4_;
    uVar5 = local_68.capTable._0_4_;
    uVar6 = local_68.capTable._4_4_;
  }
  local_d8.segment = (SegmentBuilder *)CONCAT44(uVar4,uVar3);
  local_d8.capTable = (CapTableBuilder *)CONCAT44(uVar6,uVar5);
  PointerReader::getCapability(&local_88);
  OStack_e8.disposer = (Disposer *)CONCAT71(local_88.segment._1_7_,local_88.segment._0_1_);
  OStack_e8.ptr = (ClientHook *)local_88.capTable;
  local_f0 = (SegmentBuilder *)&capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_d8.segment = local_b8.segment;
  local_d8.capTable = local_b8.capTable;
  local_d8.pointer = local_b8.pointers;
  PointerBuilder::setCapability(&local_d8,&OStack_e8);
  pCVar1 = OStack_e8.ptr;
  if ((CapTableReader *)OStack_e8.ptr != (CapTableReader *)0x0) {
    OStack_e8.ptr = (ClientHook *)0x0;
    (**(OStack_e8.disposer)->_vptr_Disposer)
              (OStack_e8.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  OVar7 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_d8);
  PVar8.super_PromiseBase.node.ptr = OVar7.ptr;
  *(SegmentBuilder **)&this->super_Server = local_d8.segment;
  *(CapTableBuilder **)&(this->super_Server).field_0x8 = local_d8.capTable;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::echo(EchoContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  result.setCap(params.getCap());
  return kj::READY_NOW;
}